

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall TPZTensor<double>::CopyToTensor(TPZTensor<double> *this,TPZFMatrix<double> *Tensor)

{
  double dVar1;
  double *pdVar2;
  
  (*(Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (Tensor);
  dVar1 = *(this->fData).super_TPZVec<double>.fStore;
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,0,0);
  *pdVar2 = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[1];
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,1,0);
  *pdVar2 = dVar1;
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,0,1);
  *pdVar2 = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[2];
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,2,0);
  *pdVar2 = dVar1;
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,0,2);
  *pdVar2 = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[3];
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,1,1);
  *pdVar2 = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[4];
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,2,1);
  *pdVar2 = dVar1;
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,1,2);
  *pdVar2 = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[5];
  pdVar2 = TPZFMatrix<double>::operator()(Tensor,2,2);
  *pdVar2 = dVar1;
  return;
}

Assistant:

void TPZTensor<T>::CopyToTensor(TPZFMatrix<T> & Tensor) const {
    Tensor.Resize(3, 3);
    Tensor(0, 0) = XX();
    Tensor(0, 1) = Tensor(1, 0) = XY();
    Tensor(0, 2) = Tensor(2, 0) = XZ();
    Tensor(1, 1) = YY();
    Tensor(1, 2) = Tensor(2, 1) = YZ();
    Tensor(2, 2) = ZZ();
}